

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

int test_layer<ncnn::Padding>
              (char *layer_type,ParamDict *pd,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *weights
              ,Option *_opt,Mat *a,float epsilon,_func_void_Padding_ptr *func)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  pointer pMVar9;
  undefined8 uVar10;
  undefined8 uVar13;
  undefined8 uVar16;
  int iVar19;
  Option *opt;
  long lVar20;
  size_t j;
  long lVar21;
  ulong uVar22;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights_fp16;
  Mat top_shape;
  Mat a_fp16;
  _func_void_Padding_ptr *p_Var23;
  float local_190;
  int local_18c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_178;
  char *local_160;
  Mat local_158;
  ParamDict *local_110;
  _func_void_Padding_ptr *local_108;
  long local_100;
  Option local_f8;
  undefined8 local_d0;
  Allocator *pAStack_c8;
  Allocator *local_c0;
  undefined4 uStack_b8;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined1 local_b0;
  undefined2 uStack_af;
  undefined1 uStack_ad;
  undefined8 local_a8;
  Allocator *pAStack_a0;
  Allocator *local_98;
  uint6 uStack_90;
  undefined2 uStack_8a;
  undefined1 local_88;
  undefined1 uStack_87;
  undefined2 uStack_86;
  Mat local_78;
  undefined2 uVar5;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar18;
  
  lVar21 = 0;
  local_160 = layer_type;
  local_110 = pd;
  local_108 = func;
  do {
    ncnn::Option::Option((Option *)(&local_f8.lightmode + lVar21));
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0x78);
  uVar1 = _opt->use_int8_arithmetic;
  uVar6 = _opt->use_bf16_storage;
  local_f8.lightmode = _opt->lightmode;
  local_f8._1_3_ = *(undefined3 *)&_opt->field_0x1;
  local_f8.num_threads = _opt->num_threads;
  local_f8.blob_allocator = _opt->blob_allocator;
  local_f8.workspace_allocator = _opt->workspace_allocator;
  uVar10._0_1_ = _opt->use_winograd_convolution;
  uVar10._1_1_ = _opt->use_sgemm_convolution;
  uVar10._2_1_ = _opt->use_int8_inference;
  uVar10._3_1_ = _opt->use_vulkan_compute;
  uVar10._4_1_ = _opt->use_fp16_packed;
  uVar10._5_1_ = _opt->use_fp16_storage;
  uVar11 = _opt->use_fp16_arithmetic;
  uVar12 = _opt->use_int8_storage;
  uVar10._6_2_ = CONCAT11(uVar12,uVar11);
  local_f8._33_2_ = 0;
  local_f8.use_int8_arithmetic = (bool)uVar1;
  local_f8.use_bf16_storage = (bool)uVar6;
  local_f8._24_4_ = SUB84(uVar10,0);
  local_f8._28_2_ = 0;
  local_f8._30_2_ = uVar10._6_2_;
  uVar2 = _opt->use_int8_arithmetic;
  uVar7 = _opt->use_bf16_storage;
  uVar13._0_1_ = _opt->use_winograd_convolution;
  uVar13._1_1_ = _opt->use_sgemm_convolution;
  uVar13._2_1_ = _opt->use_int8_inference;
  uVar13._3_1_ = _opt->use_vulkan_compute;
  uVar13._4_1_ = _opt->use_fp16_packed;
  uVar13._5_1_ = _opt->use_fp16_storage;
  uVar14 = _opt->use_fp16_arithmetic;
  uVar15 = _opt->use_int8_storage;
  uVar13._6_2_ = CONCAT11(uVar15,uVar14);
  local_c0 = _opt->workspace_allocator;
  local_d0._0_1_ = _opt->lightmode;
  local_d0._1_3_ = *(undefined3 *)&_opt->field_0x1;
  local_d0._4_4_ = _opt->num_threads;
  pAStack_c8 = _opt->blob_allocator;
  _local_b0 = CONCAT13(uVar7,CONCAT21(0x101,uVar2));
  _uStack_b8 = CONCAT26(uVar13._6_2_,CONCAT24(1,(int)uVar13));
  uVar3 = _opt->use_int8_arithmetic;
  uVar4 = _opt->use_shader_pack8;
  uVar8 = _opt->use_bf16_storage;
  uVar5 = CONCAT11(uVar8,uVar4);
  uVar16._0_1_ = _opt->use_winograd_convolution;
  uVar16._1_1_ = _opt->use_sgemm_convolution;
  uVar16._2_1_ = _opt->use_int8_inference;
  uVar16._3_1_ = _opt->use_vulkan_compute;
  uVar16._4_1_ = _opt->use_fp16_packed;
  uVar16._5_1_ = _opt->use_fp16_storage;
  uVar17 = _opt->use_fp16_arithmetic;
  uVar18 = _opt->use_int8_storage;
  uVar16._6_2_ = CONCAT11(uVar18,uVar17);
  local_98 = _opt->workspace_allocator;
  local_a8._0_1_ = _opt->lightmode;
  local_a8._1_3_ = *(undefined3 *)&_opt->field_0x1;
  local_a8._4_4_ = _opt->num_threads;
  pAStack_a0 = _opt->blob_allocator;
  _local_88 = CONCAT22(uVar5,CONCAT11(1,uVar3));
  uStack_90 = (uint6)(uint3)uVar16;
  _uStack_90 = CONCAT26(uVar16._6_2_,uStack_90);
  _local_88 = CONCAT13(1,_local_88);
  lVar21 = 0;
  do {
    if (lVar21 == 3) {
      return 0;
    }
    opt = &local_f8 + lVar21;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.h = 0;
    local_78.c = 0;
    local_78.cstep = 0;
    local_178.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_178.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_190 = epsilon * 100.0;
    local_100 = lVar21;
    if (((&local_f8)[lVar21].use_fp16_packed == false) &&
       ((&local_f8)[lVar21].use_fp16_storage != true)) {
      if ((&local_f8)[lVar21].use_bf16_storage == true) {
        local_158.elemsize._0_4_ = 0;
        local_158._20_8_ = 0;
        local_158.data = (void *)0x0;
        local_158.refcount._0_4_ = 0;
        local_158.refcount._4_4_ = 0;
        local_158.h = 0;
        local_158.c = 0;
        local_158.cstep = 0;
        local_158.allocator = (Allocator *)0x0;
        local_158.dims = 0;
        local_158.w = 0;
        ncnn::cast_float32_to_bfloat16(a,&local_158,opt);
        ncnn::cast_bfloat16_to_float32(&local_158,&local_78,opt);
        ncnn::Mat::~Mat(&local_158);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                  (&local_178,
                   (long)(weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 6);
        lVar20 = 0;
        for (uVar22 = 0;
            pMVar9 = (weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start,
            uVar22 < (ulong)((long)(weights->
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 6);
            uVar22 = uVar22 + 1) {
          local_158.elemsize._0_4_ = 0;
          local_158._20_8_ = 0;
          local_158.data = (void *)0x0;
          local_158.refcount._0_4_ = 0;
          local_158.refcount._4_4_ = 0;
          local_158.h = 0;
          local_158.c = 0;
          local_158.cstep = 0;
          local_158.allocator = (Allocator *)0x0;
          local_158.dims = 0;
          local_158.w = 0;
          ncnn::cast_float32_to_bfloat16((Mat *)((long)&pMVar9->data + lVar20),&local_158,opt);
          ncnn::cast_bfloat16_to_float32
                    (&local_158,
                     (Mat *)((long)&(local_178.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->data + lVar20),opt);
          ncnn::Mat::~Mat(&local_158);
          lVar20 = lVar20 + 0x40;
        }
      }
      else {
        ncnn::Mat::operator=(&local_78,a);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=(&local_178,weights);
        local_190 = epsilon;
      }
    }
    else {
      local_158.elemsize._0_4_ = 0;
      local_158._20_8_ = 0;
      local_158.data = (void *)0x0;
      local_158.refcount._0_4_ = 0;
      local_158.refcount._4_4_ = 0;
      local_158.h = 0;
      local_158.c = 0;
      local_158.cstep = 0;
      local_158.allocator = (Allocator *)0x0;
      local_158.dims = 0;
      local_158.w = 0;
      ncnn::cast_float32_to_float16(a,&local_158,opt);
      ncnn::cast_float16_to_float32(&local_158,&local_78,opt);
      ncnn::Mat::~Mat(&local_158);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                (&local_178,
                 (long)(weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 6);
      lVar20 = 0;
      for (uVar22 = 0;
          pMVar9 = (weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start,
          uVar22 < (ulong)((long)(weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 6);
          uVar22 = uVar22 + 1) {
        local_158.elemsize._0_4_ = 0;
        local_158._20_8_ = 0;
        local_158.data = (void *)0x0;
        local_158.refcount._0_4_ = 0;
        local_158.refcount._4_4_ = 0;
        local_158.h = 0;
        local_158.c = 0;
        local_158.cstep = 0;
        local_158.allocator = (Allocator *)0x0;
        local_158.dims = 0;
        local_158.w = 0;
        ncnn::cast_float32_to_float16((Mat *)((long)&pMVar9->data + lVar20),&local_158,opt);
        ncnn::cast_float16_to_float32
                  (&local_158,
                   (Mat *)((long)&(local_178.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start)->data + lVar20),opt);
        ncnn::Mat::~Mat(&local_158);
        lVar20 = lVar20 + 0x40;
      }
    }
    local_158.elemsize._0_4_ = 0;
    local_158._20_8_ = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.h = 0;
    local_158.c = 0;
    local_158.cstep = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    iVar19 = ncnn::layer_to_index(local_160);
    p_Var23 = local_108;
    iVar19 = test_layer<ncnn::Padding>
                       (iVar19,local_110,&local_178,opt,&local_78,&local_158,local_190,local_108);
    if (iVar19 != 0) {
      fprintf(_stderr,
              "test_layer %s failed use_packing_layout=%d use_fp16_packed=%d use_shader_pack8=%d use_bf16_storage=%d\n"
              ,local_160,(ulong)(&local_f8)[lVar21].use_packing_layout,
              (ulong)(&local_f8)[lVar21].use_fp16_packed,(ulong)(&local_f8)[lVar21].use_shader_pack8
              ,CONCAT44((int)((ulong)p_Var23 >> 0x20),(uint)(&local_f8)[lVar21].use_bf16_storage));
      local_18c = iVar19;
    }
    ncnn::Mat::~Mat(&local_158);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_178);
    ncnn::Mat::~Mat(&local_78);
    lVar21 = local_100 + 1;
  } while (iVar19 == 0);
  return local_18c;
}

Assistant:

int test_layer(const char* layer_type, const ncnn::ParamDict& pd, const std::vector<ncnn::Mat>& weights, const ncnn::Option& _opt, const ncnn::Mat& a, float epsilon = 0.001, void (*func)(T*) = 0)
{
    ncnn::Option opts[3];
    opts[0] = _opt;
    opts[0].use_packing_layout = false;
    opts[0].use_fp16_packed = false;
    opts[0].use_fp16_storage = false;
    opts[0].use_shader_pack8 = false;
    opts[1] = _opt;
    opts[1].use_packing_layout = true;
    opts[1].use_fp16_packed = true;
    opts[1].use_fp16_storage = false;
    opts[1].use_shader_pack8 = true;
    opts[2] = _opt;
    opts[2].use_packing_layout = true;
    opts[2].use_vulkan_compute = false;
    opts[2].use_fp16_packed = false;
    opts[2].use_fp16_storage = false;
    opts[2].use_bf16_storage = true;

    for (int i = 0; i < 3; i++)
    {
        const ncnn::Option& opt = opts[i];

        // fp16 representation
        ncnn::Mat a_fp16;
        std::vector<ncnn::Mat> weights_fp16;
        float epsilon_fp16;
        if (opt.use_fp16_packed || opt.use_fp16_storage)
        {
            {
                ncnn::Mat tmp;
                ncnn::cast_float32_to_float16(a, tmp, opt);
                ncnn::cast_float16_to_float32(tmp, a_fp16, opt);
            }
            weights_fp16.resize(weights.size());
            for (size_t j = 0; j < weights.size(); j++)
            {
                ncnn::Mat tmp;
                ncnn::cast_float32_to_float16(weights[j], tmp, opt);
                ncnn::cast_float16_to_float32(tmp, weights_fp16[j], opt);
            }
            epsilon_fp16 = epsilon * 100;// 0.1
        }
        else if (opt.use_bf16_storage)
        {
            {
                ncnn::Mat tmp;
                ncnn::cast_float32_to_bfloat16(a, tmp, opt);
                ncnn::cast_bfloat16_to_float32(tmp, a_fp16, opt);
            }
            weights_fp16.resize(weights.size());
            for (size_t j = 0; j < weights.size(); j++)
            {
                ncnn::Mat tmp;
                ncnn::cast_float32_to_bfloat16(weights[j], tmp, opt);
                ncnn::cast_bfloat16_to_float32(tmp, weights_fp16[j], opt);
            }
            epsilon_fp16 = epsilon * 100;// 0.1
        }
        else
        {
            a_fp16 = a;
            weights_fp16 = weights;
            epsilon_fp16 = epsilon;
        }

        ncnn::Mat top_shape;
        int ret = test_layer<T>(ncnn::layer_to_index(layer_type), pd, weights_fp16, opt, a_fp16, top_shape, epsilon_fp16, func);
        if (ret != 0)
        {
            fprintf(stderr, "test_layer %s failed use_packing_layout=%d use_fp16_packed=%d use_shader_pack8=%d use_bf16_storage=%d\n", layer_type, opt.use_packing_layout, opt.use_fp16_packed, opt.use_shader_pack8, opt.use_bf16_storage);
            return ret;
        }
    }

    return 0;
}